

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# feat.c
# Opt level: O1

int32 feat_s2mfc_read_norm_pad
                (feat_t *fcb,char *file,int32 win,int32 sf,int32 ef,mfcc_t ***out_mfc,int32 maxfr,
                int32 cepsize)

{
  mfcc_t **ppmVar1;
  mfcc_t mVar2;
  mfcc_t *pointer;
  int iVar3;
  mfcc_t **ppmVar4;
  int32 iVar5;
  uint uVar6;
  FILE *__stream;
  char *fmt;
  uint uVar7;
  long lVar8;
  int iVar9;
  ulong uVar10;
  int iVar11;
  ulong uVar12;
  int iVar13;
  int iVar14;
  uint uVar15;
  ulong uVar16;
  size_t __n;
  int32 n_float32;
  stat statbuf;
  uint local_10c;
  mfcc_t **local_108;
  FILE *local_100;
  ulong local_f8;
  ulong local_f0;
  ulong local_e8;
  int local_dc;
  size_t local_d8;
  ulong local_d0;
  ulong local_c8;
  stat local_c0;
  
  if (out_mfc != (mfcc_t ***)0x0) {
    *out_mfc = (mfcc_t **)0x0;
  }
  uVar15 = ef;
  err_msg(ERR_INFO,
          "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/libs/libsphinxbase/feat/feat.c"
          ,0x3ff,"Reading mfc file: \'%s\'[%d..%d]\n",file,(ulong)(uint)sf,ef);
  if (ef <= sf && -1 < ef) {
    err_msg(ERR_ERROR,
            "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/libs/libsphinxbase/feat/feat.c"
            ,0x401,"%s: End frame (%d) <= Start frame (%d)\n",file,ef,sf);
    return -1;
  }
  iVar5 = stat_retry(file,&local_c0);
  if ((iVar5 < 0) || (__stream = fopen(file,"rb"), __stream == (FILE *)0x0)) {
    err_msg_system(ERR_ERROR,
                   "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/libs/libsphinxbase/feat/feat.c"
                   ,0x408,"Failed to open file \'%s\' for reading",file);
    return -1;
  }
  local_108 = (mfcc_t **)CONCAT44(local_108._4_4_,win);
  iVar5 = fread_retry(&local_10c,4,1,(FILE *)__stream);
  if (iVar5 == 1) {
    uVar10 = (ulong)local_10c;
    iVar13 = local_10c * 4 + 4;
    uVar6 = local_10c;
    local_100 = __stream;
    if ((iVar13 == (int)local_c0.st_size) ||
       (uVar6 = local_10c >> 0x18 | (local_10c & 0xff0000) >> 8 | (local_10c & 0xff00) << 8 |
                local_10c << 0x18, uVar6 * 4 + 4 == (int)local_c0.st_size)) {
      local_10c = uVar6;
      uVar10 = (ulong)local_10c;
      if ((int)local_10c < 1) {
        fmt = "%s: Header size field (#floats) = %d\n";
        lVar8 = 0x426;
      }
      else {
        lVar8 = (long)(int)local_10c;
        uVar6 = (uint)(lVar8 / (long)cepsize);
        if (uVar6 * cepsize != local_10c) {
          err_msg(ERR_ERROR,
                  "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/libs/libsphinxbase/feat/feat.c"
                  ,0x42f,"Header size field: %d; not multiple of %d\n",(ulong)local_10c,
                  (ulong)(uint)cepsize,uVar15);
          __stream = local_100;
          goto LAB_00120d4d;
        }
        if (sf < (int)uVar6 || sf < 1) {
          local_f8 = local_c0.st_size;
          if (ef < 0) {
            ef = uVar6 - 1;
          }
          else if ((int)uVar6 <= ef) {
            err_msg(ERR_WARN,
                    "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/libs/libsphinxbase/feat/feat.c"
                    ,0x441,"%s: End frame (%d) beyond file size (%d), will truncate\n",file,ef,uVar6
                   );
            ef = uVar6 - 1;
          }
          uVar10 = (ulong)(uint)maxfr;
          iVar11 = sf - (int)local_108;
          iVar9 = ef + (int)local_108;
          iVar14 = 0;
          if (0 < iVar11) {
            iVar14 = iVar11;
          }
          uVar7 = iVar11 >> 0x1f & -iVar11;
          uVar12 = (ulong)((iVar9 - uVar6) + 1);
          iVar3 = uVar6 - 1;
          if (iVar9 < (int)uVar6) {
            uVar12 = 0;
            iVar3 = iVar9;
          }
          uVar15 = (iVar3 - iVar14) + 1;
          uVar16 = (ulong)uVar15;
          if ((int)uVar6 <= (int)uVar15) {
            uVar16 = lVar8 / (long)cepsize & 0xffffffff;
          }
          iVar9 = (int)uVar16;
          if ((maxfr < 1) || (uVar15 = uVar7 + iVar9 + (int)uVar12, (int)uVar15 <= maxfr)) {
            if (out_mfc != (mfcc_t ***)0x0) {
              local_c8 = (ulong)(uVar7 + iVar9);
              local_d8 = (size_t)cepsize;
              local_f0 = uVar12;
              local_e8 = (ulong)uVar7;
              local_dc = iVar13;
              local_108 = (mfcc_t **)
                          __ckd_calloc_2d__((long)(int)(uVar7 + iVar9 + (int)uVar12),local_d8,4,
                                            "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/libs/libsphinxbase/feat/feat.c"
                                            ,0x462);
              if (0 < iVar11) {
                fseek(local_100,(long)(iVar14 * cepsize) << 2,1);
              }
              local_10c = iVar9 * cepsize;
              uVar10 = local_e8 & 0xffffffff;
              pointer = local_108[uVar10];
              uVar15 = fread_retry(pointer,4,local_10c,(FILE *)local_100);
              if (uVar15 != local_10c) {
                err_msg(ERR_ERROR,
                        "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/libs/libsphinxbase/feat/feat.c"
                        ,0x46c,"%s: fread(%dx%d) (MFC data) failed\n",file,uVar16,cepsize);
                ckd_free_2d(local_108);
                __stream = local_100;
                goto LAB_00120d4d;
              }
              ppmVar1 = local_108 + uVar10;
              if ((local_dc != (int)local_f8) && (0 < (int)local_10c)) {
                lVar8 = 0;
                do {
                  mVar2 = pointer[lVar8];
                  pointer[lVar8] =
                       (mfcc_t)((uint)mVar2 >> 0x18 | ((uint)mVar2 & 0xff0000) >> 8 |
                                ((uint)mVar2 & 0xff00) << 8 | (int)mVar2 << 0x18);
                  lVar8 = lVar8 + 1;
                } while (lVar8 < (int)local_10c);
              }
              local_d0 = uVar10;
              feat_cmn(fcb,ppmVar1,iVar9,1,1);
              feat_agc(fcb,ppmVar1,iVar9,1,1);
              uVar10 = local_d0;
              ppmVar4 = local_108;
              if (0 < (int)local_e8) {
                local_f8 = local_d8 * 4;
                uVar12 = 0;
                do {
                  memcpy(ppmVar4[uVar12],*ppmVar1,local_f8);
                  uVar12 = uVar12 + 1;
                } while (uVar12 < uVar10);
              }
              ppmVar1 = local_108;
              if (0 < (int)local_f0) {
                lVar8 = (long)(int)local_c8;
                __n = local_d8 << 2;
                local_f8 = local_f0 & 0xffffffff;
                uVar10 = 0;
                do {
                  memcpy(ppmVar1[lVar8 + uVar10],local_108[lVar8 + -1],__n);
                  uVar10 = uVar10 + 1;
                } while (local_f8 != uVar10);
              }
              *out_mfc = local_108;
              uVar7 = (uint)local_e8;
              uVar12 = local_f0;
            }
            fclose(local_100);
            return iVar9 + uVar7 + (int)uVar12;
          }
          fmt = "%s: Maximum output size(%d frames) < actual #frames(%d)\n";
          lVar8 = 0x45a;
        }
        else {
          fmt = "%s: Start frame (%d) beyond file size (%d)\n";
          lVar8 = 0x438;
          uVar10 = (ulong)(uint)sf;
          uVar15 = uVar6;
        }
      }
    }
    else {
      fmt = "%s: Header size field: %d(%08x); filesize: %d(%08x)\n";
      lVar8 = 0x41d;
      uVar15 = local_10c;
    }
    err_msg(ERR_ERROR,
            "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/libs/libsphinxbase/feat/feat.c"
            ,lVar8,fmt,file,uVar10,uVar15);
    __stream = local_100;
  }
  else {
    err_msg(ERR_ERROR,
            "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/libs/libsphinxbase/feat/feat.c"
            ,0x40e,"%s: fread(#floats) failed\n",file);
  }
LAB_00120d4d:
  fclose(__stream);
  return -1;
}

Assistant:

static int32
feat_s2mfc_read_norm_pad(feat_t *fcb, char *file, int32 win,
            		 int32 sf, int32 ef,
            		 mfcc_t ***out_mfc,
            		 int32 maxfr,
            		 int32 cepsize)
{
    FILE *fp;
    int32 n_float32;
    float32 *float_feat;
    struct stat statbuf;
    int32 i, n, byterev;
    int32 start_pad, end_pad;
    mfcc_t **mfc;

    /* Initialize the output pointer to NULL, so that any attempts to
       free() it if we fail before allocating it will not segfault! */
    if (out_mfc)
        *out_mfc = NULL;
    E_INFO("Reading mfc file: '%s'[%d..%d]\n", file, sf, ef);
    if (ef >= 0 && ef <= sf) {
        E_ERROR("%s: End frame (%d) <= Start frame (%d)\n", file, ef, sf);
        return -1;
    }

    /* Find filesize; HACK!! To get around intermittent NFS failures, use stat_retry */
    if ((stat_retry(file, &statbuf) < 0)
        || ((fp = fopen(file, "rb")) == NULL)) {
        E_ERROR_SYSTEM("Failed to open file '%s' for reading", file);
        return -1;
    }

    /* Read #floats in header */
    if (fread_retry(&n_float32, sizeof(int32), 1, fp) != 1) {
        E_ERROR("%s: fread(#floats) failed\n", file);
        fclose(fp);
        return -1;
    }

    /* Check if n_float32 matches file size */
    byterev = 0;
    if ((int32) (n_float32 * sizeof(float32) + 4) != (int32) statbuf.st_size) { /* RAH, typecast both sides to remove compile warning */
        n = n_float32;
        SWAP_INT32(&n);

        if ((int32) (n * sizeof(float32) + 4) != (int32) (statbuf.st_size)) {   /* RAH, typecast both sides to remove compile warning */
            E_ERROR
                ("%s: Header size field: %d(%08x); filesize: %d(%08x)\n",
                 file, n_float32, n_float32, statbuf.st_size,
                 statbuf.st_size);
            fclose(fp);
            return -1;
        }

        n_float32 = n;
        byterev = 1;
    }
    if (n_float32 <= 0) {
        E_ERROR("%s: Header size field (#floats) = %d\n", file, n_float32);
        fclose(fp);
        return -1;
    }

    /* Convert n to #frames of input */
    n = n_float32 / cepsize;
    if (n * cepsize != n_float32) {
        E_ERROR("Header size field: %d; not multiple of %d\n", n_float32,
                cepsize);
        fclose(fp);
        return -1;
    }

    /* Check start and end frames */
    if (sf > 0) {
        if (sf >= n) {
            E_ERROR("%s: Start frame (%d) beyond file size (%d)\n", file,
                    sf, n);
            fclose(fp);
            return -1;
        }
    }
    if (ef < 0)
        ef = n-1;
    else if (ef >= n) {
        E_WARN("%s: End frame (%d) beyond file size (%d), will truncate\n",
               file, ef, n);
        ef = n-1;
    }

    /* Add window to start and end frames */
    sf -= win;
    ef += win;
    if (sf < 0) {
        start_pad = -sf;
        sf = 0;
    }
    else
        start_pad = 0;
    if (ef >= n) {
        end_pad = ef - n + 1;
        ef = n - 1;
    }
    else
        end_pad = 0;

    /* Limit n if indicated by [sf..ef] */
    if ((ef - sf + 1) < n)
        n = (ef - sf + 1);
    if (maxfr > 0 && n + start_pad + end_pad > maxfr) {
        E_ERROR("%s: Maximum output size(%d frames) < actual #frames(%d)\n",
                file, maxfr, n + start_pad + end_pad);
        fclose(fp);
        return -1;
    }

    /* If no output buffer was supplied, then skip the actual data reading. */
    if (out_mfc != NULL) {
        /* Position at desired start frame and read actual MFC data */
        mfc = (mfcc_t **)ckd_calloc_2d(n + start_pad + end_pad, cepsize, sizeof(mfcc_t));
        if (sf > 0)
            fseek(fp, sf * cepsize * sizeof(float32), SEEK_CUR);
        n_float32 = n * cepsize;
#ifdef FIXED_POINT
        float_feat = ckd_calloc(n_float32, sizeof(float32));
#else
        float_feat = mfc[start_pad];
#endif
        if (fread_retry(float_feat, sizeof(float32), n_float32, fp) != n_float32) {
            E_ERROR("%s: fread(%dx%d) (MFC data) failed\n", file, n, cepsize);
            ckd_free_2d(mfc);
            fclose(fp);
            return -1;
        }
        if (byterev) {
            for (i = 0; i < n_float32; i++) {
                SWAP_FLOAT32(&float_feat[i]);
            }
        }
#ifdef FIXED_POINT
        for (i = 0; i < n_float32; ++i) {
            mfc[start_pad][i] = FLOAT2MFCC(float_feat[i]);
        }
        ckd_free(float_feat);
#endif

        /* Normalize */
        feat_cmn(fcb, mfc + start_pad, n, 1, 1);
        feat_agc(fcb, mfc + start_pad, n, 1, 1);

        /* Replicate start and end frames if necessary. */
        for (i = 0; i < start_pad; ++i)
            memcpy(mfc[i], mfc[start_pad], cepsize * sizeof(mfcc_t));
        for (i = 0; i < end_pad; ++i)
            memcpy(mfc[start_pad + n + i], mfc[start_pad + n - 1],
                   cepsize * sizeof(mfcc_t));

        *out_mfc = mfc;
    }

    fclose(fp);
    return n + start_pad + end_pad;
}